

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O3

void __thiscall
ValidationSignals::NewPoWValidBlock
          (ValidationSignals *this,CBlockIndex *pindex,shared_ptr<const_CBlock> *block)

{
  _List_node_base *p_Var1;
  bool *pbVar2;
  _Head_base<0UL,_ValidationSignalsImpl_*,_false> _Var3;
  _List_node_base *p_Var4;
  string_view source_file;
  bool bVar5;
  Logger *pLVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  iterator __position;
  iterator __ret;
  list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_> *this_00
  ;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  string log_msg;
  uint256 local_158;
  string local_138 [4];
  string local_b8;
  reverse_lock local_98;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar6 = LogInstance();
  bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar6,VALIDATION,Debug);
  if (bVar5) {
    CBlockHeader::GetHash
              (&local_158,
               &((block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_CBlockHeader);
    base_blob<256u>::ToString_abi_cxx11_(local_138,&local_158);
    pLVar6 = LogInstance();
    bVar5 = BCLog::Logger::Enabled(pLVar6);
    if (bVar5) {
      pbVar2 = &local_98.templock.super_unique_lock._M_owns;
      local_98.templock.super_unique_lock._M_device = (mutex_type *)0x0;
      local_98.templock.super_unique_lock._M_owns = false;
      local_98.lock = (UniqueLock<AnnotatedMixin<std::mutex>_> *)pbVar2;
      tinyformat::format<char[17],std::__cxx11::string>
                (&local_b8,(tinyformat *)0xfded76,"NewPoWValidBlock",(char (*) [17])local_138,in_R8)
      ;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                 &local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      pLVar6 = LogInstance();
      local_b8._M_dataplus._M_p = (pointer)0x60;
      local_b8._M_string_length = 0xfdeb72;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp"
      ;
      source_file._M_len = 0x60;
      str._M_str = (char *)local_98.lock;
      str._M_len = (size_t)local_98.templock.super_unique_lock._M_device;
      logging_function._M_str = "NewPoWValidBlock";
      logging_function._M_len = 0x10;
      BCLog::Logger::LogPrintStr(pLVar6,str,logging_function,source_file,0x100,VALIDATION,Debug);
      if (local_98.lock != (UniqueLock<AnnotatedMixin<std::mutex>_> *)pbVar2) {
        operator_delete(local_98.lock,
                        CONCAT71(local_98.templock.super_unique_lock._9_7_,
                                 local_98.templock.super_unique_lock._M_owns) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
      operator_delete(local_138[0]._M_dataplus._M_p,local_138[0].field_2._M_allocated_capacity + 1);
    }
  }
  _Var3._M_head_impl =
       (this->m_internals)._M_t.
       super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
       _M_t.
       super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>.
       super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl;
  local_b8._M_string_length = local_b8._M_string_length & 0xffffffffffffff00;
  local_b8._M_dataplus._M_p = (pointer)_Var3._M_head_impl;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_b8);
  __position._M_node =
       *(_List_node_base **)
        &((_Var3._M_head_impl)->m_list).
         super__List_base<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
  ;
  this_00 = &(_Var3._M_head_impl)->m_list;
  if (__position._M_node != (_List_node_base *)this_00) {
    do {
      *(int *)&__position._M_node[2]._M_next = *(int *)&__position._M_node[2]._M_next + 1;
      UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
                (&local_98,(UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_b8,"lock",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp"
                 ,0x57);
      (*(code *)(__position._M_node[1]._M_next)->_M_next[4]._M_prev)
                (__position._M_node[1]._M_next,pindex,block);
      UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock(&local_98);
      p_Var1 = __position._M_node + 2;
      *(int *)&p_Var1->_M_next = *(int *)&p_Var1->_M_next + -1;
      p_Var4 = (__position._M_node)->_M_next;
      if (*(int *)&p_Var1->_M_next == 0) {
        std::__cxx11::
        list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>::
        _M_erase(this_00,__position);
      }
      __position._M_node = p_Var4;
    } while (p_Var4 != (_List_node_base *)this_00);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::NewPoWValidBlock(const CBlockIndex *pindex, const std::shared_ptr<const CBlock> &block) {
    LOG_EVENT("%s: block hash=%s", __func__, block->GetHash().ToString());
    m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.NewPoWValidBlock(pindex, block); });
}